

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

string * XMLIDEncode(string *__return_storage_ptr__,string *name)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  const_iterator it;
  stringstream local_1f8 [8];
  stringstream idEncoded;
  ostream local_1e8 [380];
  undefined4 local_6c;
  char local_68 [4];
  uint XML_ID_CHARS_COUNT;
  char XML_ID_CHARS [66];
  string *name_local;
  
  memcpy(local_68,"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_-.",0x42);
  local_6c = 0x42;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_1f8);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name);
    if (((*pcVar3 < 'A') ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name), 'z' < *pcVar3)) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name), *pcVar3 != '_')) {
      std::operator<<(local_1e8,'_');
    }
    local_210._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      local_218._M_current = (char *)std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=(&local_210,&local_218);
      if (!bVar1) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_210);
      pcVar3 = strchr(local_68,(int)*pcVar4);
      if (pcVar3 == (char *)0x0) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_210);
        std::operator<<(local_1e8,local_68[(uint)(int)*pcVar4 % 0x42]);
      }
      else {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_210);
        std::operator<<(local_1e8,*pcVar4);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_210);
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1f8);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  return __return_storage_ptr__;
}

Assistant:

static const std::string XMLIDEncode(const std::string& name) {
    const char XML_ID_CHARS[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_-.";
    const unsigned int XML_ID_CHARS_COUNT = sizeof(XML_ID_CHARS) / sizeof(char);

    if (name.length() == 0) {
        return name;
    }

    std::stringstream idEncoded;

    // xsd:ID must start with letter or underscore
    if (!((name[0] >= 'A' && name[0] <= 'z') || name[0] == '_')) {
        idEncoded << '_';
    }

    for (std::string::const_iterator it = name.begin(); it != name.end(); ++it) {
        // xsd:ID can only contain letters, digits, underscores, hyphens and periods
        if (strchr(XML_ID_CHARS, *it) != nullptr) {
            idEncoded << *it;
        } else {
            // Select placeholder character based on invalid character to prevent name collisions 
            idEncoded << XML_ID_CHARS[(*it) % XML_ID_CHARS_COUNT];
        }
    }

    return idEncoded.str();
}